

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psl.c
# Opt level: O0

psl_ctx_t * Curl_psl_use(Curl_easy *easy)

{
  PslCache *pslcache_00;
  time_t tVar1;
  bool bVar2;
  time_t local_48;
  time_t expires;
  _Bool dynamic;
  time_t now;
  psl_ctx_t *psl;
  PslCache *pslcache;
  Curl_easy *easy_local;
  
  pslcache_00 = easy->psl;
  if (pslcache_00 == (PslCache *)0x0) {
    easy_local = (Curl_easy *)0x0;
  }
  else {
    Curl_share_lock(easy,CURL_LOCK_DATA_PSL,CURL_LOCK_ACCESS_SHARED);
    tVar1 = now_seconds();
    if ((pslcache_00->psl == (psl_ctx_t *)0x0) || (pslcache_00->expires <= tVar1)) {
      Curl_share_unlock(easy,CURL_LOCK_DATA_PSL);
      Curl_share_lock(easy,CURL_LOCK_DATA_PSL,CURL_LOCK_ACCESS_SINGLE);
      tVar1 = now_seconds();
      if ((pslcache_00->psl == (psl_ctx_t *)0x0) || (pslcache_00->expires <= tVar1)) {
        now = psl_latest(0);
        bVar2 = now != 0;
        if (tVar1 < 0x7ffffffffffc0b7f) {
          local_48 = tVar1 + 0x3f480;
        }
        else {
          local_48 = 0x7fffffffffffffff;
        }
        if ((now == 0) && ((pslcache_00->field_0x10 & 1) == 0)) {
          now = psl_builtin();
        }
        if (now != 0) {
          Curl_psl_destroy(pslcache_00);
          pslcache_00->psl = (psl_ctx_t *)now;
          pslcache_00->field_0x10 = pslcache_00->field_0x10 & 0xfe | bVar2;
          pslcache_00->expires = local_48;
        }
      }
      Curl_share_unlock(easy,CURL_LOCK_DATA_PSL);
      Curl_share_lock(easy,CURL_LOCK_DATA_PSL,CURL_LOCK_ACCESS_SHARED);
    }
    easy_local = (Curl_easy *)pslcache_00->psl;
    if (easy_local == (Curl_easy *)0x0) {
      Curl_share_unlock(easy,CURL_LOCK_DATA_PSL);
    }
  }
  return (psl_ctx_t *)easy_local;
}

Assistant:

const psl_ctx_t *Curl_psl_use(struct Curl_easy *easy)
{
  struct PslCache *pslcache = easy->psl;
  const psl_ctx_t *psl;
  time_t now;

  if(!pslcache)
    return NULL;

  Curl_share_lock(easy, CURL_LOCK_DATA_PSL, CURL_LOCK_ACCESS_SHARED);
  now = now_seconds();
  if(!pslcache->psl || pslcache->expires <= now) {
    /* Let a chance to other threads to do the job: avoids deadlock. */
    Curl_share_unlock(easy, CURL_LOCK_DATA_PSL);

    /* Update cache: this needs an exclusive lock. */
    Curl_share_lock(easy, CURL_LOCK_DATA_PSL, CURL_LOCK_ACCESS_SINGLE);

    /* Recheck in case another thread did the job. */
    now = now_seconds();
    if(!pslcache->psl || pslcache->expires <= now) {
      bool dynamic = FALSE;
      time_t expires = TIME_T_MAX;

#if defined(PSL_VERSION_NUMBER) && PSL_VERSION_NUMBER >= 0x001000
      psl = psl_latest(NULL);
      dynamic = psl != NULL;
      /* Take care of possible time computation overflow. */
      expires = now < TIME_T_MAX - PSL_TTL ? now + PSL_TTL : TIME_T_MAX;

      /* Only get the built-in PSL if we do not already have the "latest". */
      if(!psl && !pslcache->dynamic)
#endif

        psl = psl_builtin();

      if(psl) {
        Curl_psl_destroy(pslcache);
        pslcache->psl = psl;
        pslcache->dynamic = dynamic;
        pslcache->expires = expires;
      }
    }
    Curl_share_unlock(easy, CURL_LOCK_DATA_PSL);  /* Release exclusive lock. */
    Curl_share_lock(easy, CURL_LOCK_DATA_PSL, CURL_LOCK_ACCESS_SHARED);
  }
  psl = pslcache->psl;
  if(!psl)
    Curl_share_unlock(easy, CURL_LOCK_DATA_PSL);
  return psl;
}